

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_lws_status.c
# Opt level: O0

int callback_lws_status(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  uchar *buf_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  lws_vhost *plVar5;
  lws_protocols *plVar6;
  lws_context *plVar7;
  char *pcVar8;
  char *pcVar9;
  per_session_data__lws_status *local_228;
  per_session_data__lws_status **ppss;
  per_session_data__lws_status *pss2;
  int m;
  int n;
  char *end;
  char *p;
  char *start;
  char ip [24];
  char buf [400];
  per_vhost_data__lws_status *vhd;
  per_session_data__lws_status *pss;
  size_t len_local;
  void *in_local;
  void *user_local;
  lws_callback_reasons reason_local;
  lws *wsi_local;
  
  plVar5 = lws_get_vhost(wsi);
  plVar6 = lws_get_protocol(wsi);
  buf._392_8_ = lws_protocol_vh_priv_get(plVar5,plVar6);
  buf_00 = (uchar *)(buf + 7);
  switch(reason) {
  case LWS_CALLBACK_ESTABLISHED:
    *(int *)(((per_session_data__lws_status *)buf._392_8_)->user_agent + 8) =
         *(int *)(((per_session_data__lws_status *)buf._392_8_)->user_agent + 8) + 1;
    *(per_session_data__lws_status **)user = ((per_session_data__lws_status *)buf._392_8_)->next;
    ((per_session_data__lws_status *)buf._392_8_)->next = (per_session_data__lws_status *)user;
    *(byte *)((long)user + 0x128) = *(byte *)((long)user + 0x128) & 0xfb | (len != 0) << 2;
    time((time_t *)((long)user + 0x10));
    *(lws **)((long)user + 8) = wsi;
    iVar3 = lws_hdr_copy(wsi,(char *)((long)user + 0x18),0x100,WSI_TOKEN_HTTP_USER_AGENT);
    if (iVar3 < 0) {
      strcpy((char *)((long)user + 0x18),"unknown");
    }
    trigger_resend((per_vhost_data__lws_status *)buf._392_8_);
    break;
  default:
    break;
  case LWS_CALLBACK_CLOSED:
    for (local_228 = (per_session_data__lws_status *)buf._392_8_;
        local_228->next != (per_session_data__lws_status *)0x0; local_228 = local_228->next) {
      if (local_228->next == (per_session_data__lws_status *)user) {
        local_228->next = *user;
        break;
      }
    }
    trigger_resend((per_vhost_data__lws_status *)buf._392_8_);
    break;
  case LWS_CALLBACK_RECEIVE:
    _lws_log(4,"pmd test: RX len %d\n",len & 0xffffffff);
    break;
  case LWS_CALLBACK_SERVER_WRITEABLE:
    iVar3 = *(int *)((long)user + 0x118);
    if (iVar3 == 1) {
      pss2._4_4_ = LWS_WRITE_NO_FIN;
      pcVar8 = lws_get_library_version();
      bVar1 = *(byte *)((long)user + 0x128);
      pcVar9 = lws_canonical_hostname(*(lws_context **)(buf._392_8_ + 8));
      iVar3 = lws_snprintf((char *)buf_00,(size_t)(buf + (0x187 - (long)buf_00)),
                           "{ \"version\":\"%s\", \"wss_over_h2\":\"%d\", \"hostname\":\"%s\", \"wsi\":\"%d\", \"conns\":["
                           ,pcVar8,(ulong)(bVar1 >> 2 & 1),pcVar9,
                           *(undefined4 *)(buf._392_8_ + 0x20));
      end = (char *)(buf_00 + iVar3);
      *(undefined4 *)((long)user + 0x118) = 2;
      *(undefined8 *)((long)user + 0x120) = *(undefined8 *)buf._392_8_;
    }
    else {
      if (iVar3 == 2) {
        pss2._4_4_ = LWS_WRITE_NO_FIN|LWS_WRITE_CONTINUATION;
        if (*(long *)((long)user + 0x120) != 0) {
          end = (char *)buf_00;
          if ((*(byte *)((long)user + 0x128) & 1) != 0) {
            end = buf + 8;
            buf[7] = ',';
          }
          *(byte *)((long)user + 0x128) = *(byte *)((long)user + 0x128) & 0xfe | 1;
          bVar2 = false;
          for (ppss = &((per_session_data__lws_status *)buf._392_8_)->next->next;
              ppss != (per_session_data__lws_status **)0x0; ppss = &(*ppss)->next) {
            if (ppss == *(per_session_data__lws_status ***)((long)user + 0x120)) {
              bVar2 = true;
              break;
            }
          }
          if (bVar2) {
            strcpy((char *)&start,"unknown");
            lws_get_peer_simple(*(lws **)(*(long *)((long)user + 0x120) + 8),(char *)&start,0x18);
            iVar3 = lws_snprintf(end,(size_t)(buf + (0x187 - (long)end)),
                                 "{\"peer\":\"%s\",\"time\":\"%ld\",\"ua\":\"%s\"}",&start,
                                 *(undefined8 *)(*(long *)((long)user + 0x120) + 0x10),
                                 *(long *)((long)user + 0x120) + 0x18);
            end = end + iVar3;
            *(undefined8 *)((long)user + 0x120) = **(undefined8 **)((long)user + 0x120);
            if (*(long *)((long)user + 0x120) == 0) {
              *(undefined4 *)((long)user + 0x118) = 3;
            }
          }
          else {
            *(undefined4 *)((long)user + 0x118) = 3;
            *(byte *)((long)user + 0x128) = *(byte *)((long)user + 0x128) & 0xfd | 2;
          }
          goto LAB_0010c3cc;
        }
      }
      else if (iVar3 != 3) {
        return 0;
      }
      pss2._4_4_ = LWS_WRITE_CONTINUATION;
      iVar3 = lws_snprintf((char *)buf_00,4,"]}");
      end = (char *)(buf_00 + iVar3);
      if ((*(byte *)((long)user + 0x128) >> 1 & 1) == 0) {
        *(undefined4 *)((long)user + 0x118) = 0;
      }
      else {
        *(byte *)((long)user + 0x128) = *(byte *)((long)user + 0x128) & 0xfd;
        *(byte *)((long)user + 0x128) = *(byte *)((long)user + 0x128) & 0xfe;
        *(undefined8 *)((long)user + 0x120) = *(undefined8 *)buf._392_8_;
        *(undefined4 *)((long)user + 0x118) = 1;
      }
    }
LAB_0010c3cc:
    uVar4 = lws_write(wsi,buf_00,(long)end - (long)buf_00,pss2._4_4_);
    if ((int)uVar4 < 0) {
      _lws_log(1,"ERROR %d writing to di socket\n",(ulong)uVar4);
      return -1;
    }
    if (*(int *)((long)user + 0x118) != 0) {
      lws_callback_on_writable(wsi);
    }
    break;
  case LWS_CALLBACK_PROTOCOL_INIT:
    plVar5 = lws_get_vhost(wsi);
    plVar6 = lws_get_protocol(wsi);
    buf._392_8_ = lws_protocol_vh_priv_zalloc(plVar5,plVar6,0x28);
    plVar7 = lws_get_context(wsi);
    *(lws_context **)(buf._392_8_ + 8) = plVar7;
    plVar6 = lws_get_protocol(wsi);
    *(lws_protocols **)(buf._392_8_ + 0x18) = plVar6;
    plVar5 = lws_get_vhost(wsi);
    *(lws_vhost **)(buf._392_8_ + 0x10) = plVar5;
  }
  return 0;
}

Assistant:

int
callback_lws_status(struct lws *wsi, enum lws_callback_reasons reason,
		    void *user, void *in, size_t len)
{
	struct per_session_data__lws_status *pss =
			(struct per_session_data__lws_status *)user;
	struct per_vhost_data__lws_status *vhd =
			(struct per_vhost_data__lws_status *)
			lws_protocol_vh_priv_get(lws_get_vhost(wsi),
					lws_get_protocol(wsi));
	char buf[LWS_PRE + 384], ip[24], *start = buf + LWS_PRE - 1, *p = start,
	     *end = buf + sizeof(buf) - 1;
	int n, m;

	switch (reason) {

	case LWS_CALLBACK_PROTOCOL_INIT:
		vhd = lws_protocol_vh_priv_zalloc(lws_get_vhost(wsi),
				lws_get_protocol(wsi),
				sizeof(struct per_vhost_data__lws_status));
		vhd->context = lws_get_context(wsi);
		vhd->protocol = lws_get_protocol(wsi);
		vhd->vhost = lws_get_vhost(wsi);
		break;

	case LWS_CALLBACK_ESTABLISHED:

		/*
		 * This shows how to stage sending a single ws message in
		 * multiple fragments.  In this case, it lets us trade off
		 * memory needed to make the data vs time to send it.
		 */

		vhd->count_live_pss++;
		pss->next = vhd->live_pss_list;
		vhd->live_pss_list = pss;

		pss->wss_over_h2 = !!len;

		time(&pss->time_est);
		pss->wsi = wsi;

		if (lws_hdr_copy(wsi, pss->user_agent, sizeof(pss->user_agent),
			     WSI_TOKEN_HTTP_USER_AGENT) < 0) /* too big */
			strcpy(pss->user_agent, "unknown");
		trigger_resend(vhd);
		break;

	case LWS_CALLBACK_SERVER_WRITEABLE:
		switch (pss->walk) {
		case WALK_INITIAL:
			n = LWS_WRITE_TEXT | LWS_WRITE_NO_FIN;
			p += lws_snprintf(p, end - p,
				      "{ \"version\":\"%s\","
				      " \"wss_over_h2\":\"%d\","
				      " \"hostname\":\"%s\","
				      " \"wsi\":\"%d\", \"conns\":[",
				      lws_get_library_version(),
				      pss->wss_over_h2,
				      lws_canonical_hostname(vhd->context),
				      vhd->count_live_pss);
			pss->walk = WALK_LIST;
			pss->walk_next = vhd->live_pss_list;
			break;
		case WALK_LIST:
			n = LWS_WRITE_CONTINUATION | LWS_WRITE_NO_FIN;
			if (!pss->walk_next)
				goto walk_final;

			if (pss->subsequent)
				*p++ = ',';
			pss->subsequent = 1;

			m = 0;
			lws_start_foreach_ll(struct per_session_data__lws_status *,
					     pss2, vhd->live_pss_list) {
				if (pss2 == pss->walk_next) {
					m = 1;
					break;
				}
			} lws_end_foreach_ll(pss2, next);

			if (!m) {
				/* our next guy went away */
				pss->walk = WALK_FINAL;
				pss->changed_partway = 1;
				break;
			}

			strcpy(ip, "unknown");
			lws_get_peer_simple(pss->walk_next->wsi, ip, sizeof(ip));
			p += lws_snprintf(p, end - p,
					"{\"peer\":\"%s\",\"time\":\"%ld\","
					"\"ua\":\"%s\"}",
					ip, (unsigned long)pss->walk_next->time_est,
					pss->walk_next->user_agent);
			pss->walk_next = pss->walk_next->next;
			if (!pss->walk_next)
				pss->walk = WALK_FINAL;
			break;
		case WALK_FINAL:
walk_final:
			n = LWS_WRITE_CONTINUATION;
			p += lws_snprintf(p, 4, "]}");
			if (pss->changed_partway) {
				pss->changed_partway = 0;
				pss->subsequent = 0;
				pss->walk_next = vhd->live_pss_list;
				pss->walk = WALK_INITIAL;
			} else
				pss->walk = WALK_NONE;
			break;
		default:
			return 0;
		}

		m = lws_write(wsi, (unsigned char *)start, p - start, n);
		if (m < 0) {
			lwsl_err("ERROR %d writing to di socket\n", m);
			return -1;
		}

		if (pss->walk != WALK_NONE)
			lws_callback_on_writable(wsi);
		break;

	case LWS_CALLBACK_RECEIVE:
		lwsl_notice("pmd test: RX len %d\n", (int)len);
		break;

	case LWS_CALLBACK_CLOSED:
		// lwsl_debug("****** LWS_CALLBACK_CLOSED\n");
		lws_start_foreach_llp(struct per_session_data__lws_status **,
			ppss, vhd->live_pss_list) {
			if (*ppss == pss) {
				*ppss = pss->next;
				break;
			}
		} lws_end_foreach_llp(ppss, next);

		trigger_resend(vhd);
		break;

	default:
		break;
	}

	return 0;
}